

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

int stb_filewrite(char *filename,void *data,size_t length)

{
  FILE *__s;
  size_t sVar1;
  size_t local_50;
  size_t len3;
  size_t len2;
  size_t remaining;
  uchar *data_ptr;
  FILE *f;
  size_t length_local;
  void *data_local;
  char *filename_local;
  
  __s = (FILE *)stb_fopen(filename,"wb");
  len2 = length;
  remaining = (size_t)data;
  if (__s != (FILE *)0x0) {
    for (; len2 != 0; len2 = len2 - local_50) {
      if (len2 < 0x10001) {
        local_50 = len2;
      }
      else {
        local_50 = 0x10000;
      }
      sVar1 = fwrite((void *)remaining,1,local_50,__s);
      if (local_50 != sVar1) {
        fprintf(_stderr,"Failed while writing %s\n",filename);
        break;
      }
      remaining = local_50 + remaining;
    }
    stb_fclose((FILE *)__s,2);
  }
  return (int)(__s != (FILE *)0x0);
}

Assistant:

int stb_filewrite(char *filename, void *data, size_t length)
{
   FILE *f = stb_fopen(filename, "wb");
   if (f) {
      unsigned char *data_ptr = (unsigned char *) data;
      size_t remaining = length;
      while (remaining > 0) {
         size_t len2 = remaining > 65536 ? 65536 : remaining;
         size_t len3 = fwrite(data_ptr, 1, len2, f);
         if (len2 != len3) {
            fprintf(stderr, "Failed while writing %s\n", filename);
            break;
         }
         remaining -= len2;
         data_ptr += len2;
      }
      stb_fclose(f, stb_keep_if_different);
   }
   return f != NULL;
}